

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O0

int4 __thiscall
PcodeInjectLibrarySleigh::manualCallFixup
          (PcodeInjectLibrarySleigh *this,string *name,string *snippetstring)

{
  uint id;
  InjectPayload *pIVar1;
  InjectPayloadSleigh *payload;
  int4 injectid;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string sourceName;
  string *snippetstring_local;
  string *name_local;
  PcodeInjectLibrarySleigh *this_local;
  
  std::operator+((char *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "(manual callfixup name=\"");
  std::operator+(local_40,(char *)local_60);
  std::__cxx11::string::~string(local_60);
  id = (**(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary)(this,local_40,name,1);
  pIVar1 = PcodeInjectLibrary::getPayload(&this->super_PcodeInjectLibrary,id);
  std::__cxx11::string::operator=((string *)&pIVar1[1].name,(string *)snippetstring);
  (*(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary[1])(this,(ulong)id);
  std::__cxx11::string::~string((string *)local_40);
  return id;
}

Assistant:

int4 PcodeInjectLibrarySleigh::manualCallFixup(const string &name,const string &snippetstring)

{
  string sourceName = "(manual callfixup name=\"" + name + "\")";
  int4 injectid = allocateInject(sourceName, name, InjectPayload::CALLFIXUP_TYPE);
  InjectPayloadSleigh *payload = (InjectPayloadSleigh *)getPayload(injectid);
  payload->parsestring = snippetstring;
  registerInject(injectid);
  return injectid;
}